

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtrclient.c
# Opt level: O2

int template_enter(void *closure,char *name)

{
  long lVar1;
  int iVar2;
  int iVar3;
  size_t __n;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __n = strlen(name);
  iVar2 = strncmp("roas",name,__n);
  if (iVar2 == 0) {
    *(undefined1 *)closure = 1;
    *(undefined4 *)((long)closure + 4) = 0;
LAB_00103661:
    iVar2 = 1;
  }
  else {
    iVar2 = *(int *)((long)closure + 4);
    if (iVar2 != 0) {
      iVar3 = strcmp("last",name);
      if ((iVar3 == 0) && (iVar2 == *(int *)(*(long *)((long)closure + 8) + 0x108) + -1))
      goto LAB_00103661;
    }
    iVar2 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int template_enter(void *closure, const char *name)
{
	struct exporter_state *state = closure;

	if (strncmp("roas", name, strlen(name)) == 0) {
		state->roa_section = true;
		state->current_roa = 0;

		return 1;

	} else if (state->current_roa && strcmp("last", name) == 0 &&
		   state->current_roa == tommy_array_size(state->roas) - 1) {
		return 1;
	}

	return 0;
}